

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O3

void __thiscall
BasicLoggerTimeFixture_EpochInUTC_Test::~BasicLoggerTimeFixture_EpochInUTC_Test
          (BasicLoggerTimeFixture_EpochInUTC_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (BasicLoggerTimeFixture, EpochInUTC) {
    time_zone_setter tzs ("UTC0");
    std::size_t const r =
        pstore::basic_logger::time_string (std::time_t{0}, pstore::gsl::make_span (buffer_));
    EXPECT_EQ (std::size_t{24}, r);
    EXPECT_EQ ('\0', buffer_[24]);
    this->canonicalize_sign ();
    EXPECT_STREQ ("1970-01-01T00:00:00-0000", buffer_.data ());
}